

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void rpc_tests::CheckRpc(vector<RPCArg,_std::allocator<RPCArg>_> *params,UniValue *args,
                        RPCMethodImpl *test_impl)

{
  string m_key_name;
  string name;
  RPCResult result;
  string description;
  string description_00;
  RPCResults results;
  RPCExamples examples;
  long in_FS_OFFSET;
  RPCHelpMan rpc;
  RPCResult null_result;
  _Alloc_hider in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb20 [24];
  _Alloc_hider in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb40 [24];
  _Vector_impl_data in_stack_fffffffffffffb58;
  pointer in_stack_fffffffffffffb70;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  undefined8 in_stack_fffffffffffffb90;
  _Alloc_hider in_stack_fffffffffffffb98;
  size_type in_stack_fffffffffffffba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<UniValue,_std::allocator<UniValue>_> local_430;
  undefined1 local_418 [88];
  undefined1 local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  undefined8 local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  VType local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  vector<UniValue,_std::allocator<UniValue>_> vStack_358;
  undefined4 local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  undefined8 local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  undefined8 local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  undefined8 uStack_2a8;
  long *local_2a0;
  undefined8 local_298;
  long local_290;
  undefined8 uStack_288;
  RPCResult local_280;
  long *local_1f8 [2];
  long local_1e8 [2];
  _Any_data local_1d8;
  _Manager_type local_1c8 [2];
  RPCHelpMan local_1b8;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  RPCResult local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"None","");
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffb20._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb20._8_16_;
  m_key_name._M_dataplus._M_p = in_stack_fffffffffffffb18._M_p;
  description._M_string_length = in_stack_fffffffffffffb40._0_8_;
  description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb40._8_16_;
  description._M_dataplus._M_p = in_stack_fffffffffffffb38._M_p;
  ::RPCResult::RPCResult
            (&local_c0,NONE,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb58,
             SUB81(local_e0,0));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb78);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  local_1d8._M_unused._M_object = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"dummy","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dummy description","");
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb60,params);
  ::RPCResult::RPCResult(&local_280,&local_c0);
  result.m_key_name._0_24_ = in_stack_fffffffffffffb20;
  result._0_8_ = in_stack_fffffffffffffb18._M_p;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffb38._M_p;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<RPCResult,_std::allocator<RPCResult>_>)
       (_Vector_base<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb40;
  result._64_24_ = in_stack_fffffffffffffb58;
  result.m_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb70;
  result.m_description.field_2._8_8_ = pRVar1;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar2;
  result.m_cond._M_string_length = (size_type)pRVar3;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffb98._M_p;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffb48,result);
  local_2c0 = (long *)&local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  if (local_2c0 == (long *)&local_2b0) {
    uStack_288 = uStack_2a8;
    local_2a0 = &local_290;
  }
  else {
    local_2a0 = local_2c0;
  }
  local_290 = CONCAT71(uStack_2af,local_2b0);
  local_298 = local_2b8;
  local_2b8 = 0;
  local_2b0 = 0;
  local_2c0 = (long *)&local_2b0;
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             &stack0xfffffffffffffb28,test_impl);
  name._M_string_length = in_stack_fffffffffffffb20._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_fffffffffffffb20._8_16_;
  name._M_dataplus._M_p = &stack0xfffffffffffffb28;
  description_00._M_string_length = in_stack_fffffffffffffb40._0_8_;
  description_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb40._8_16_;
  description_00._M_dataplus._M_p = in_stack_fffffffffffffb38._M_p;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar1;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb70;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar2;
  examples.m_examples._M_string_length = in_stack_fffffffffffffb90;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb98._M_p;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffba0;
  RPCHelpMan::RPCHelpMan
            (&local_1b8,name,description_00,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffb58,results,examples,
             (RPCMethodImpl *)&local_1d8);
  if ((code *)in_stack_fffffffffffffb38._M_p != (code *)0x0) {
    (*(code *)in_stack_fffffffffffffb38._M_p)(&stack0xfffffffffffffb28,&stack0xfffffffffffffb28,3);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_2c0 != (long *)&local_2b0) {
    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_cond._M_dataplus._M_p != &local_280.m_cond.field_2) {
    operator_delete(local_280.m_cond._M_dataplus._M_p,
                    local_280.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
    operator_delete(local_280.m_description._M_dataplus._M_p,
                    local_280.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_280.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_key_name._M_dataplus._M_p != &local_280.m_key_name.field_2) {
    operator_delete(local_280.m_key_name._M_dataplus._M_p,
                    local_280.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb60);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if ((_Manager_type *)local_1d8._M_unused._0_8_ != local_1c8) {
    operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8[0] + 1));
  }
  local_418._8_8_ = (long)&(((_Storage<UniValue,_false> *)local_418)->_M_value).val + 0x10;
  local_418._0_4_ = VNULL;
  local_418[0x18] = 0;
  local_418._16_8_ = 0;
  local_418._40_8_ = (pointer)0x0;
  local_418._48_8_ = (pointer)0x0;
  local_418._56_8_ = (pointer)0x0;
  local_418._64_8_ = (pointer)0x0;
  local_418._72_8_ = (pointer)0x0;
  local_418._80_8_ = (pointer)0x0;
  local_3c0 = 1;
  local_3b8 = &local_3a8;
  local_3b0 = 0;
  local_3a8._M_local_buf[0] = '\0';
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_338 = &local_328;
  local_370.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_358.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_358.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_358.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_340 = 0;
  local_330 = 0;
  local_328._M_local_buf[0] = '\0';
  local_318 = &local_308;
  local_310 = 0;
  local_308._M_local_buf[0] = '\0';
  local_2f8 = &local_2e8;
  local_2f0 = 0;
  local_2e8._M_local_buf[0] = '\0';
  local_2c8 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_398 = args->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_390,&args->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_370,&args->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&vStack_358,&args->values);
  RPCHelpMan::HandleRequest
            ((UniValue *)&stack0xfffffffffffffb90,&local_1b8,
             (JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_418)->_M_value);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_430);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffb98._M_p != &local_458) {
    operator_delete(in_stack_fffffffffffffb98._M_p,local_458._M_allocated_capacity + 1);
  }
  JSONRPCRequest::~JSONRPCRequest
            ((JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_418)->_M_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_examples.m_examples._M_dataplus._M_p !=
      &local_1b8.m_examples.m_examples.field_2) {
    operator_delete(local_1b8.m_examples.m_examples._M_dataplus._M_p,
                    local_1b8.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b8.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1b8.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
    operator_delete(local_1b8.m_description._M_dataplus._M_p,
                    local_1b8.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b8.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_1b8.m_fun,(_Any_data *)&local_1b8.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
    operator_delete(local_1b8.m_name._M_dataplus._M_p,
                    local_1b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_cond._M_dataplus._M_p != &local_c0.m_cond.field_2) {
    operator_delete(local_c0.m_cond._M_dataplus._M_p,
                    local_c0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
    operator_delete(local_c0.m_description._M_dataplus._M_p,
                    local_c0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_key_name._M_dataplus._M_p != &local_c0.m_key_name.field_2) {
    operator_delete(local_c0.m_key_name._M_dataplus._M_p,
                    local_c0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckRpc(const std::vector<RPCArg>& params, const UniValue& args, RPCHelpMan::RPCMethodImpl test_impl)
{
    auto null_result{RPCResult{RPCResult::Type::NONE, "", "None"}};
    const RPCHelpMan rpc{"dummy", "dummy description", params, null_result, RPCExamples{""}, test_impl};
    JSONRPCRequest req;
    req.params = args;

    rpc.HandleRequest(req);
}